

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall CS248::DynamicScene::Scene::bevel_selected_element(Scene *this)

{
  long in_RDI;
  Mesh *mesh;
  Mesh *in_stack_00000170;
  long local_28;
  
  if (*(long *)(in_RDI + 0x68) != *(long *)(in_RDI + 0x38)) {
    if (*(long *)(in_RDI + 0x30) == 0) {
      local_28 = 0;
    }
    else {
      local_28 = __dynamic_cast(*(long *)(in_RDI + 0x30),&SceneObject::typeinfo,&Mesh::typeinfo,0);
    }
    if (local_28 != 0) {
      Mesh::bevel_selected_element(in_stack_00000170);
      memcpy((void *)(in_RDI + 0x60),(void *)(in_RDI + 0x30),0x2c);
    }
  }
  return;
}

Assistant:

void Scene::bevel_selected_element() {
  // Don't re-bevel an element that we're already editing (i.e., beveling)
  if (edited.element == selected.element) return;

  Mesh *mesh = dynamic_cast<Mesh *>(selected.object);
  if (mesh) {
    mesh->bevel_selected_element();
    edited = selected;
  }
}